

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.cpp
# Opt level: O2

void __thiscall
license::CryptoHelper::loadPrivateKey_file(CryptoHelper *this,string *privateKey_file_name)

{
  bool bVar1;
  logic_error *this_00;
  string pk_string;
  ifstream private_key;
  undefined8 auStack_140 [36];
  
  std::__cxx11::string::string((string *)&private_key,(string *)privateKey_file_name);
  bVar1 = boost::filesystem::exists((path *)&private_key);
  std::__cxx11::string::~string((string *)&private_key);
  if (bVar1) {
    std::ifstream::ifstream(&private_key,(string *)privateKey_file_name,_S_in);
    pk_string._M_dataplus._M_p = (pointer)&pk_string.field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&pk_string,
               *(undefined8 *)((long)auStack_140 + *(long *)(_private_key + -0x18)),
               0xffffffffffffffff,0,0xffffffff);
    (*this->_vptr_CryptoHelper[4])(this,&pk_string);
    std::__cxx11::string::~string((string *)&pk_string);
    std::ifstream::~ifstream(&private_key);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&pk_string,"Private key file [",privateKey_file_name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&private_key,
                 &pk_string,"] does not exists");
  std::logic_error::logic_error(this_00,(string *)&private_key);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void CryptoHelper::loadPrivateKey_file(const std::string &privateKey_file_name) {
	if (!fs::exists(privateKey_file_name)) {
		throw logic_error("Private key file [" + privateKey_file_name + "] does not exists");
	}
	std::ifstream private_key(privateKey_file_name);
	std::string pk_string((std::istreambuf_iterator<char>(private_key)), std::istreambuf_iterator<char>());
	loadPrivateKey(pk_string);
}